

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileLED.cpp
# Opt level: O3

void __thiscall TileLED::updateLED(TileLED *this,State state)

{
  uint uVar1;
  TileLED *this_00;
  _Elt_pointer ppTVar2;
  Vector2u *pVVar3;
  Board *pBVar4;
  Tile *pTVar5;
  Vector2u local_3c;
  State local_34;
  
  local_34 = state;
  _addNextTile(this,&this->super_Tile,NORTH,&local_34);
  if (LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    do {
      ppTVar2 = LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppTVar2 = LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      this_00 = ppTVar2[-1];
      std::deque<TileLED_*,_std::allocator<TileLED_*>_>::pop_back(&LEDNodes.c);
      pVVar3 = Tile::getPosition(&this_00->super_Tile);
      if (pVVar3->y != 0) {
        pBVar4 = Tile::getBoardPtr(&this->super_Tile);
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        local_3c.y = pVVar3->y - 1;
        local_3c.x = uVar1;
        pTVar5 = Board::getTile(pBVar4,&local_3c);
        _addNextTile(this,pTVar5,NORTH,&local_34);
      }
      pVVar3 = Tile::getPosition(&this_00->super_Tile);
      uVar1 = pVVar3->x;
      pBVar4 = Tile::getBoardPtr(&this->super_Tile);
      pVVar3 = Board::getSize(pBVar4);
      if (uVar1 < pVVar3->x - 1) {
        pBVar4 = Tile::getBoardPtr(&this->super_Tile);
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        local_3c.y = pVVar3->y;
        local_3c.x = uVar1 + 1;
        pTVar5 = Board::getTile(pBVar4,&local_3c);
        _addNextTile(this,pTVar5,EAST,&local_34);
      }
      pVVar3 = Tile::getPosition(&this_00->super_Tile);
      uVar1 = pVVar3->y;
      pBVar4 = Tile::getBoardPtr(&this->super_Tile);
      pVVar3 = Board::getSize(pBVar4);
      if (uVar1 < pVVar3->y - 1) {
        pBVar4 = Tile::getBoardPtr(&this->super_Tile);
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        local_3c.y = pVVar3->y + 1;
        local_3c.x = uVar1;
        pTVar5 = Board::getTile(pBVar4,&local_3c);
        _addNextTile(this,pTVar5,SOUTH,&local_34);
      }
      pVVar3 = Tile::getPosition(&this_00->super_Tile);
      if (pVVar3->x != 0) {
        pBVar4 = Tile::getBoardPtr(&this->super_Tile);
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(&this_00->super_Tile);
        local_3c.y = pVVar3->y;
        local_3c.x = uVar1 - 1;
        pTVar5 = Board::getTile(pBVar4,&local_3c);
        _addNextTile(this,pTVar5,WEST,&local_34);
      }
    } while (LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             LEDNodes.c.super__Deque_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  if (traversedLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      traversedLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    traversedLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         traversedLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void TileLED::updateLED(State state) {
    assert(traversedLEDs.empty());
    assert(LEDNodes.empty());
    
    //cout << "Update LED started at (" << getPosition().x << ", " << getPosition().y << ")." << endl;
    
    _addNextTile(this, NORTH, state);
    while (!LEDNodes.empty()) {    // Start a depth-first traversal on the connected LEDs.
        TileLED* currentLED = LEDNodes.top();
        LEDNodes.pop();
        
        //cout << "  currently at (" << currentLED->getPosition().x << ", " << currentLED->getPosition().y << ")" << endl;
        
        if (currentLED->getPosition().y > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x, currentLED->getPosition().y - 1)), NORTH, state);
        }
        if (currentLED->getPosition().x < getBoardPtr()->getSize().x - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x + 1, currentLED->getPosition().y)), EAST, state);
        }
        if (currentLED->getPosition().y < getBoardPtr()->getSize().y - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x, currentLED->getPosition().y + 1)), SOUTH, state);
        }
        if (currentLED->getPosition().x > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentLED->getPosition().x - 1, currentLED->getPosition().y)), WEST, state);
        }
    }
    traversedLEDs.clear();
}